

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBase.c
# Opt level: O2

ZyanStatus
ZydisFormatterBasePrintDecorator
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context,
          ZydisDecorator decorator)

{
  ZydisRoundingMode ZVar1;
  ZydisMaskMode ZVar2;
  ZyanStatus ZVar3;
  ZydisLetterCase letter_case;
  ZydisPredefinedTokenDECO_EH_ *data;
  ZydisShortString *source;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0x24a,
                  "ZyanStatus ZydisFormatterBasePrintDecorator(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisDecorator)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0x24b,
                  "ZyanStatus ZydisFormatterBasePrintDecorator(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisDecorator)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0x24c,
                  "ZyanStatus ZydisFormatterBasePrintDecorator(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisDecorator)"
                 );
  }
  ZVar3 = 0x80100004;
  switch(decorator) {
  case ZYDIS_DECORATOR_MASK:
    if ((context->instruction->avx).mask.reg == ZYDIS_REGISTER_K0) goto switchD_0011dd13_caseD_0;
    if (buffer->is_token_list == '\0') {
      ZVar3 = ZydisStringAppendShort(&buffer->string,&STR_DECO_BEGIN);
      if ((int)ZVar3 < 0) {
        return ZVar3;
      }
      ZVar3 = (*formatter->func_print_register)
                        (formatter,buffer,context,(context->instruction->avx).mask.reg);
      if ((int)ZVar3 < 0) {
        return ZVar3;
      }
LAB_0011dfa9:
      ZVar3 = ZydisStringAppendShort(&buffer->string,&STR_DECO_END);
    }
    else {
      ZVar3 = ZydisFormatterBufferAppendPredefined
                        (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_BEGIN);
      if ((int)ZVar3 < 0) {
        return ZVar3;
      }
      ZVar3 = (*formatter->func_print_register)
                        (formatter,buffer,context,(context->instruction->avx).mask.reg);
      if ((int)ZVar3 < 0) {
        return ZVar3;
      }
      if (buffer->is_token_list == '\0') goto LAB_0011dfa9;
      ZVar3 = ZydisFormatterBufferAppendPredefined
                        (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_END);
    }
    if ((int)ZVar3 < 0) {
      return ZVar3;
    }
    ZVar2 = (context->instruction->avx).mask.mode;
    if (((ZVar2 != ZYDIS_MASK_MODE_CONTROL_ZEROING) && (ZVar2 != ZYDIS_MASK_MODE_REQUIRED_BITS)) ||
       ((context->instruction->raw).field_3.xop.offset == '\0')) goto switchD_0011dd13_caseD_0;
    if (buffer->is_token_list != '\0') {
      data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_ZERO;
      break;
    }
    letter_case = formatter->case_decorators;
    source = &STR_DECO_ZERO;
LAB_0011e26e:
    ZVar3 = ZydisStringAppendShortCase(&buffer->string,source,letter_case);
    goto LAB_0011e276;
  case ZYDIS_DECORATOR_BC:
    if ((context->instruction->avx).broadcast.is_static == '\0') {
      switch((context->instruction->avx).broadcast.mode) {
      case ZYDIS_BROADCAST_MODE_INVALID:
        goto switchD_0011dd13_caseD_0;
      case ZYDIS_BROADCAST_MODE_1_TO_2:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_1TO2;
          goto LAB_0011e26e;
        }
        data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_1TO2;
        break;
      case ZYDIS_BROADCAST_MODE_1_TO_4:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_1TO4;
          goto LAB_0011e26e;
        }
        data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_1TO4;
        break;
      case ZYDIS_BROADCAST_MODE_1_TO_8:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_1TO8;
          goto LAB_0011e26e;
        }
        data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_1TO8;
        break;
      case ZYDIS_BROADCAST_MODE_1_TO_16:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_1TO16;
          goto LAB_0011e26e;
        }
        data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_1TO16;
        break;
      case ZYDIS_BROADCAST_MODE_1_TO_32:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_1TO32;
          goto LAB_0011e26e;
        }
        data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_1TO32;
        break;
      case ZYDIS_BROADCAST_MODE_1_TO_64:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_1TO64;
          goto LAB_0011e26e;
        }
        data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_1TO64;
        break;
      default:
        goto switchD_0011dbab_default;
      case ZYDIS_BROADCAST_MODE_4_TO_8:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_4TO8;
          goto LAB_0011e26e;
        }
        data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_4TO8;
        break;
      case ZYDIS_BROADCAST_MODE_4_TO_16:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_4TO16;
          goto LAB_0011e26e;
        }
        data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_4TO16;
        break;
      case ZYDIS_BROADCAST_MODE_8_TO_16:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_8TO16;
          goto LAB_0011e26e;
        }
        data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_8TO16;
      }
      break;
    }
    goto switchD_0011dd13_caseD_0;
  case ZYDIS_DECORATOR_RC:
    ZVar1 = (context->instruction->avx).rounding.mode;
    if ((context->instruction->avx).has_sae == '\0') {
      switch(ZVar1) {
      case ZYDIS_ROUNDING_MODE_INVALID:
        goto switchD_0011dd13_caseD_0;
      case ZYDIS_ROUNDING_MODE_RN:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_RN;
          goto LAB_0011e26e;
        }
        data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_RN;
        break;
      case ZYDIS_ROUNDING_MODE_RD:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_RD;
          goto LAB_0011e26e;
        }
        data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_RD;
        break;
      case ZYDIS_ROUNDING_MODE_REQUIRED_BITS:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_RU;
          goto LAB_0011e26e;
        }
        data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_RU;
        break;
      case ZYDIS_ROUNDING_MODE_MAX_VALUE:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_RZ;
          goto LAB_0011e26e;
        }
        data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_RZ;
        break;
      default:
        goto switchD_0011dbab_default;
      }
    }
    else {
      switch(ZVar1) {
      case ZYDIS_ROUNDING_MODE_INVALID:
        goto switchD_0011dd13_caseD_0;
      case ZYDIS_ROUNDING_MODE_RN:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_RN_SAE;
          goto LAB_0011e26e;
        }
        data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_RN_SAE;
        break;
      case ZYDIS_ROUNDING_MODE_RD:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_RD_SAE;
          goto LAB_0011e26e;
        }
        data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_RD_SAE;
        break;
      case ZYDIS_ROUNDING_MODE_REQUIRED_BITS:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_RU_SAE;
          goto LAB_0011e26e;
        }
        data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_RU_SAE;
        break;
      case ZYDIS_ROUNDING_MODE_MAX_VALUE:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_RZ_SAE;
          goto LAB_0011e26e;
        }
        data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_RZ_SAE;
        break;
      default:
        goto switchD_0011dbab_default;
      }
    }
    break;
  case ZYDIS_DECORATOR_SAE:
    if (((context->instruction->avx).has_sae == '\0') ||
       ((context->instruction->avx).rounding.mode != ZYDIS_ROUNDING_MODE_INVALID))
    goto switchD_0011dd13_caseD_0;
    if (buffer->is_token_list == '\0') {
      letter_case = formatter->case_decorators;
      source = &STR_DECO_SAE;
      goto LAB_0011e26e;
    }
    data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_SAE;
    break;
  case ZYDIS_DECORATOR_SWIZZLE:
    switch((context->instruction->avx).swizzle.mode) {
    case ZYDIS_SWIZZLE_MODE_INVALID:
    case ZYDIS_SWIZZLE_MODE_DCBA:
      goto switchD_0011dd13_caseD_0;
    case ZYDIS_SWIZZLE_MODE_CDAB:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_CDAB;
        goto LAB_0011e26e;
      }
      data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_CDAB;
      break;
    case ZYDIS_SWIZZLE_MODE_BADC:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_BADC;
        goto LAB_0011e26e;
      }
      data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_BADC;
      break;
    case ZYDIS_SWIZZLE_MODE_DACB:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_DACB;
        goto LAB_0011e26e;
      }
      data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_DACB;
      break;
    case ZYDIS_SWIZZLE_MODE_AAAA:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_AAAA;
        goto LAB_0011e26e;
      }
      data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_AAAA;
      break;
    case ZYDIS_SWIZZLE_MODE_BBBB:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_BBBB;
        goto LAB_0011e26e;
      }
      data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_BBBB;
      break;
    case ZYDIS_SWIZZLE_MODE_CCCC:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_CCCC;
        goto LAB_0011e26e;
      }
      data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_CCCC;
      break;
    case ZYDIS_SWIZZLE_MODE_DDDD:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_DDDD;
        goto LAB_0011e26e;
      }
      data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_DDDD;
      break;
    default:
      goto switchD_0011dbab_default;
    }
    break;
  case ZYDIS_DECORATOR_CONVERSION:
    switch((context->instruction->avx).conversion.mode) {
    case ZYDIS_CONVERSION_MODE_INVALID:
      goto switchD_0011dd13_caseD_0;
    case ZYDIS_CONVERSION_MODE_FLOAT16:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_FLOAT16;
        goto LAB_0011e26e;
      }
      data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_FLOAT16;
      break;
    case ZYDIS_CONVERSION_MODE_SINT8:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_SINT8;
        goto LAB_0011e26e;
      }
      data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_SINT8;
      break;
    case ZYDIS_CONVERSION_MODE_REQUIRED_BITS:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_UINT8;
        goto LAB_0011e26e;
      }
      data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_UINT8;
      break;
    case ZYDIS_CONVERSION_MODE_SINT16:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_SINT16;
        goto LAB_0011e26e;
      }
      data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_SINT16;
      break;
    case ZYDIS_CONVERSION_MODE_MAX_VALUE:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_UINT16;
        goto LAB_0011e26e;
      }
      data = (ZydisPredefinedTokenDECO_EH_ *)&TOK_DATA_DECO_UINT16;
      break;
    default:
      return 0x80100004;
    }
    break;
  case ZYDIS_DECORATOR_EH:
    if ((context->instruction->avx).has_eviction_hint == '\0') goto switchD_0011dd13_caseD_0;
    if (buffer->is_token_list == '\0') {
      letter_case = formatter->case_decorators;
      source = &STR_DECO_EH;
      goto LAB_0011e26e;
    }
    data = &TOK_DATA_DECO_EH;
    break;
  default:
    goto switchD_0011dbab_default;
  }
  ZVar3 = ZydisFormatterBufferAppendPredefined(buffer,(ZydisPredefinedToken *)data);
LAB_0011e276:
  if ((int)ZVar3 < 0) {
    return ZVar3;
  }
switchD_0011dd13_caseD_0:
  ZVar3 = 0x100000;
switchD_0011dbab_default:
  return ZVar3;
}

Assistant:

ZyanStatus ZydisFormatterBasePrintDecorator(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context, ZydisDecorator decorator)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

#if defined(ZYDIS_DISABLE_AVX512) && defined(ZYDIS_DISABLE_KNC)
    ZYAN_UNUSED(formatter);
    ZYAN_UNUSED(buffer);
    ZYAN_UNUSED(context);
#endif

    switch (decorator)
    {
    case ZYDIS_DECORATOR_MASK:
    {
#if !defined(ZYDIS_DISABLE_AVX512) || !defined(ZYDIS_DISABLE_KNC)
        if (context->instruction->avx.mask.reg != ZYDIS_REGISTER_K0)
        {
            if (buffer->is_token_list)
            {
                ZYDIS_BUFFER_APPEND(buffer, DECO_BEGIN);
                ZYAN_CHECK(formatter->func_print_register(formatter, buffer, context,
                    context->instruction->avx.mask.reg));
                ZYDIS_BUFFER_APPEND(buffer, DECO_END);
            } else
            {
                ZYAN_CHECK(ZydisStringAppendShort(&buffer->string, &STR_DECO_BEGIN));
                ZYAN_CHECK(formatter->func_print_register(formatter, buffer, context,
                    context->instruction->avx.mask.reg));
                ZYAN_CHECK(ZydisStringAppendShort(&buffer->string, &STR_DECO_END));
            }

            // Only print the zeroing decorator, if the instruction is not a "zeroing masking only"
            // instruction (e.g. `vcmpsd`)
            if ((context->instruction->avx.mask.mode == ZYDIS_MASK_MODE_ZEROING ||
                 context->instruction->avx.mask.mode == ZYDIS_MASK_MODE_CONTROL_ZEROING) &&
                (context->instruction->raw.evex.z))
            {
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_ZERO, formatter->case_decorators);
            }
        }
#endif
        break;
    }
    case ZYDIS_DECORATOR_BC:
#if !defined(ZYDIS_DISABLE_AVX512)
        if (!context->instruction->avx.broadcast.is_static)
        {
            switch (context->instruction->avx.broadcast.mode)
            {
            case ZYDIS_BROADCAST_MODE_INVALID:
                break;
            case ZYDIS_BROADCAST_MODE_1_TO_2:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_1TO2, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_1_TO_4:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_1TO4, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_1_TO_8:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_1TO8, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_1_TO_16:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_1TO16, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_1_TO_32:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_1TO32, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_1_TO_64:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_1TO64, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_4_TO_8:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_4TO8, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_4_TO_16:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_4TO16, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_8_TO_16:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_8TO16, formatter->case_decorators);
                break;
            default:
                return ZYAN_STATUS_INVALID_ARGUMENT;
            }
        }
#endif
        break;
    case ZYDIS_DECORATOR_RC:
#if !defined(ZYDIS_DISABLE_AVX512)
        if (context->instruction->avx.has_sae)
        {
            switch (context->instruction->avx.rounding.mode)
            {
            case ZYDIS_ROUNDING_MODE_INVALID:
                break;
            case ZYDIS_ROUNDING_MODE_RN:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RN_SAE, formatter->case_decorators);
                break;
            case ZYDIS_ROUNDING_MODE_RD:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RD_SAE, formatter->case_decorators);
                break;
            case ZYDIS_ROUNDING_MODE_RU:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RU_SAE, formatter->case_decorators);
                break;
            case ZYDIS_ROUNDING_MODE_RZ:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RZ_SAE, formatter->case_decorators);
                break;
            default:
                return ZYAN_STATUS_INVALID_ARGUMENT;
            }
        } else
        {
            switch (context->instruction->avx.rounding.mode)
            {
            case ZYDIS_ROUNDING_MODE_INVALID:
                break;
            case ZYDIS_ROUNDING_MODE_RN:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RN, formatter->case_decorators);
                break;
            case ZYDIS_ROUNDING_MODE_RD:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RD, formatter->case_decorators);
                break;
            case ZYDIS_ROUNDING_MODE_RU:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RU, formatter->case_decorators);
                break;
            case ZYDIS_ROUNDING_MODE_RZ:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RZ, formatter->case_decorators);
                break;
            default:
                return ZYAN_STATUS_INVALID_ARGUMENT;
            }
        }
#endif
        break;
    case ZYDIS_DECORATOR_SAE:
#if !defined(ZYDIS_DISABLE_AVX512)
        if (context->instruction->avx.has_sae && !context->instruction->avx.rounding.mode)
        {
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_SAE, formatter->case_decorators);
        }
#endif
        break;
    case ZYDIS_DECORATOR_SWIZZLE:
#if !defined(ZYDIS_DISABLE_KNC)
        switch (context->instruction->avx.swizzle.mode)
        {
        case ZYDIS_SWIZZLE_MODE_INVALID:
        case ZYDIS_SWIZZLE_MODE_DCBA:
            // Nothing to do here
            break;
        case ZYDIS_SWIZZLE_MODE_CDAB:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_CDAB, formatter->case_decorators);
            break;
        case ZYDIS_SWIZZLE_MODE_BADC:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_BADC, formatter->case_decorators);
            break;
        case ZYDIS_SWIZZLE_MODE_DACB:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_DACB, formatter->case_decorators);
            break;
        case ZYDIS_SWIZZLE_MODE_AAAA:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_AAAA, formatter->case_decorators);
            break;
        case ZYDIS_SWIZZLE_MODE_BBBB:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_BBBB, formatter->case_decorators);
            break;
        case ZYDIS_SWIZZLE_MODE_CCCC:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_CCCC, formatter->case_decorators);
            break;
        case ZYDIS_SWIZZLE_MODE_DDDD:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_DDDD, formatter->case_decorators);
            break;
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
#endif
        break;
    case ZYDIS_DECORATOR_CONVERSION:
#if !defined(ZYDIS_DISABLE_KNC)
        switch (context->instruction->avx.conversion.mode)
        {
        case ZYDIS_CONVERSION_MODE_INVALID:
            break;
        case ZYDIS_CONVERSION_MODE_FLOAT16:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_FLOAT16, formatter->case_decorators);
            break;
        case ZYDIS_CONVERSION_MODE_SINT8:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_SINT8, formatter->case_decorators);
            break;
        case ZYDIS_CONVERSION_MODE_UINT8:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_UINT8, formatter->case_decorators);
            break;
        case ZYDIS_CONVERSION_MODE_SINT16:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_SINT16, formatter->case_decorators);
            break;
        case ZYDIS_CONVERSION_MODE_UINT16:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_UINT16, formatter->case_decorators);
            break;
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
#endif
        break;
    case ZYDIS_DECORATOR_EH:
#if !defined(ZYDIS_DISABLE_KNC)
        if (context->instruction->avx.has_eviction_hint)
        {
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_EH, formatter->case_decorators);
        }
#endif
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    return ZYAN_STATUS_SUCCESS;
}